

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::HandleExceptionsInMethodIfSupported<testing::Test,void>
               (Test *object,offset_in_Test_to_subr method,char *location)

{
  bool bVar1;
  UnitTestImpl *this;
  long in_RDX;
  code *in_RSI;
  long in_RDI;
  AssertionException *anon_var_0;
  GoogleTestFailureException *anon_var_0_1;
  exception *e;
  code *local_c8;
  char *in_stack_ffffffffffffff48;
  offset_in_Test_to_subr in_stack_ffffffffffffff50;
  Test *in_stack_ffffffffffffff60;
  
  this = GetUnitTestImpl();
  bVar1 = UnitTestImpl::catch_exceptions(this);
  if (bVar1) {
    HandleSehExceptionsInMethodIfSupported<testing::Test,void>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  else {
    local_c8 = in_RSI;
    if (((ulong)in_RSI & 1) != 0) {
      local_c8 = *(code **)(in_RSI + *(long *)(in_RDI + in_RDX) + -1);
    }
    (*local_c8)((long *)(in_RDI + in_RDX));
  }
  return;
}

Assistant:

Result HandleExceptionsInMethodIfSupported(T* object, Result (T::*method)(),
                                           const char* location) {
  // NOTE: The user code can affect the way in which Google Test handles
  // exceptions by setting GTEST_FLAG(catch_exceptions), but only before
  // RUN_ALL_TESTS() starts. It is technically possible to check the flag
  // after the exception is caught and either report or re-throw the
  // exception based on the flag's value:
  //
  // try {
  //   // Perform the test method.
  // } catch (...) {
  //   if (GTEST_FLAG_GET(catch_exceptions))
  //     // Report the exception as failure.
  //   else
  //     throw;  // Re-throws the original exception.
  // }
  //
  // However, the purpose of this flag is to allow the program to drop into
  // the debugger when the exception is thrown. On most platforms, once the
  // control enters the catch block, the exception origin information is
  // lost and the debugger will stop the program at the point of the
  // re-throw in this function -- instead of at the point of the original
  // throw statement in the code under test.  For this reason, we perform
  // the check early, sacrificing the ability to affect Google Test's
  // exception handling in the method where the exception is thrown.
  if (internal::GetUnitTestImpl()->catch_exceptions()) {
#if GTEST_HAS_EXCEPTIONS
    try {
      return HandleSehExceptionsInMethodIfSupported(object, method, location);
    } catch (const AssertionException&) {  // NOLINT
      // This failure was reported already.
    } catch (const internal::GoogleTestFailureException&) {  // NOLINT
      // This exception type can only be thrown by a failed Google
      // Test assertion with the intention of letting another testing
      // framework catch it.  Therefore we just re-throw it.
      throw;
    } catch (const std::exception& e) {  // NOLINT
      internal::ReportFailureInUnknownLocation(
          TestPartResult::kFatalFailure,
          FormatCxxExceptionMessage(e.what(), location));
    } catch (...) {  // NOLINT
      internal::ReportFailureInUnknownLocation(
          TestPartResult::kFatalFailure,
          FormatCxxExceptionMessage(nullptr, location));
    }
    return static_cast<Result>(0);
#else
    return HandleSehExceptionsInMethodIfSupported(object, method, location);
#endif  // GTEST_HAS_EXCEPTIONS
  } else {
    return (object->*method)();
  }
}